

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizard::setButtonText(QWizard *this,WizardButton which,QString *text)

{
  bool bVar1;
  QWizardPrivate *this_00;
  iterator this_01;
  QWizardPage *pQVar2;
  QWizard *in_RDI;
  long in_FS_OFFSET;
  QWizardPrivate *unaff_retaddr;
  QWizardPrivate *d;
  byte local_41;
  int *in_stack_ffffffffffffffc8;
  long lVar3;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QWizard *)0x7bb8d3);
  bVar1 = QWizardPrivate::ensureButton(unaff_retaddr,(WizardButton)((ulong)lVar3 >> 0x20));
  if (bVar1) {
    this_01._M_node =
         (_Base_ptr)
         QMap<int,_QString>::insert
                   ((QMap<int,_QString> *)this_00,in_stack_ffffffffffffffc8,(QString *)in_RDI);
    pQVar2 = currentPage(in_RDI);
    local_41 = 1;
    if (pQVar2 != (QWizardPage *)0x0) {
      currentPage(in_RDI);
      QWizardPage::d_func((QWizardPage *)0x7bb942);
      bVar1 = QMap<int,_QString>::contains((QMap<int,_QString> *)this_00,(int *)this_01._M_node);
      local_41 = bVar1 ^ 0xff;
    }
    if ((local_41 & 1) != 0) {
      QAbstractButton::setText((QAbstractButton *)this_01._M_node,(QString *)in_RDI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWizard::setButtonText(WizardButton which, const QString &text)
{
    Q_D(QWizard);

    if (!d->ensureButton(which))
        return;

    d->buttonCustomTexts.insert(which, text);

    if (!currentPage() || !currentPage()->d_func()->buttonCustomTexts.contains(which))
        d->btns[which]->setText(text);
}